

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O1

void __thiscall chrono::ChConveyor::Update(ChConveyor *this,double mytime,bool update_assets)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  undefined7 in_register_00000031;
  ChBody *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ChVector<double> v;
  ChVector<double> local_38;
  
  ChPhysicsItem::Update(&this->super_ChPhysicsItem,mytime,update_assets);
  (*(this->conveyor_truss->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_truss,CONCAT71(in_register_00000031,update_assets) & 0xffffffff);
  bVar11 = ChBody::GetBodyFixed(this->conveyor_truss);
  if (bVar11) {
    ChVariablesBodyOwnMass::SetBodyMass(&this->conveyor_plate->variables,100000.0);
    local_38.m_data[0] = 100000.0;
    local_38.m_data[1] = 100000.0;
    local_38.m_data[2] = 100000.0;
    ChBody::SetInertiaXX(this->conveyor_plate,&local_38);
    pCVar12 = this->conveyor_plate;
    local_38.m_data[0] = 0.0;
    local_38.m_data[1] = 0.0;
    local_38.m_data[2] = 0.0;
  }
  else {
    ChVariablesBodyOwnMass::SetBodyMass
              (&this->conveyor_plate->variables,(this->conveyor_truss->variables).mass);
    pCVar12 = this->conveyor_plate;
    ChBody::GetInertiaXX(this->conveyor_truss);
    ChBody::SetInertiaXX(pCVar12,&local_38);
    pCVar12 = this->conveyor_plate;
    ChBody::GetInertiaXY(this->conveyor_truss);
  }
  ChBody::SetInertiaXY(pCVar12,&local_38);
  ChFrame<double>::SetCoord
            ((ChFrame<double> *)&this->conveyor_plate->super_ChBodyFrame,
             &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord);
  (*(this->conveyor_plate->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
    _vptr_ChFrame[6])(&this->conveyor_plate->super_ChBodyFrame,
                      &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
                       coord_dt);
  pCVar12 = this->conveyor_truss;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = this->conveyor_speed;
  auVar18 = ZEXT816(0) << 0x40;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar13 = vfmadd231sd_fma(auVar19,auVar14,auVar13);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar13 = vfmadd231sd_fma(auVar13,auVar18,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar20,auVar14,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar18,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar21,auVar14,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar18,auVar6);
  local_38.m_data[0] =
       auVar13._0_8_ +
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[0] + (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  local_38.m_data[1] =
       auVar2._0_8_ +
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[1] + (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  local_38.m_data[2] =
       auVar3._0_8_ +
       (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[2] + (pCVar12->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  (*(this->conveyor_plate->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
    _vptr_ChFrame[7])(&this->conveyor_plate->super_ChBodyFrame);
  (*(this->conveyor_plate->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_plate,update_assets);
  peVar7 = (this->internal_link->motion_X).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var8 = (this->internal_link->motion_X).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = this->conveyor_speed;
    auVar18._8_8_ = 0x8000000000000000;
    auVar18._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar15,auVar18);
    pp_Var1 = (_func_int **)vmovlpd_avx(auVar13);
    peVar7[2]._vptr_ChFunction = pp_Var1;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = this->conveyor_speed;
      auVar10._8_8_ = 0x8000000000000000;
      auVar10._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar16,auVar10);
      pp_Var1 = (_func_int **)vmovlpd_avx(auVar13);
      peVar7[2]._vptr_ChFunction = pp_Var1;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = this->conveyor_speed;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar17,auVar9);
      pp_Var1 = (_func_int **)vmovlpd_avx(auVar13);
      peVar7[2]._vptr_ChFunction = pp_Var1;
      if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00546502;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
LAB_00546502:
  peVar7 = (this->internal_link->motion_X).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var8 = (this->internal_link->motion_X).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar7[1]._vptr_ChFunction =
         (_func_int **)(this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      peVar7[1]._vptr_ChFunction =
           (_func_int **)(this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
      peVar7[1]._vptr_ChFunction =
           (_func_int **)(this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime);
      if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00546593;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
LAB_00546593:
  (**(code **)((long)(this->internal_link->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.
                     super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj + 0x98))
            (mytime,this->internal_link,update_assets);
  return;
}

Assistant:

void ChConveyor::Update(double mytime, bool update_assets) {
    // inherit parent class function
    ChPhysicsItem::Update(mytime, update_assets);

    conveyor_truss->Update(mytime, update_assets);

    if (conveyor_truss->GetBodyFixed()) {
        double largemass = 100000;
        conveyor_plate->SetMass(largemass);
        conveyor_plate->SetInertiaXX(ChVector<>(largemass, largemass, largemass));
        conveyor_plate->SetInertiaXY(ChVector<>(0, 0, 0));
    } else {
        conveyor_plate->SetMass(conveyor_truss->GetMass());
        conveyor_plate->SetInertiaXX(conveyor_truss->GetInertiaXX());
        conveyor_plate->SetInertiaXY(conveyor_truss->GetInertiaXY());
    }

    // keep the plate always at the same position of the main reference
    conveyor_plate->SetCoord(conveyor_truss->GetCoord());
    conveyor_plate->SetCoord_dt(conveyor_truss->GetCoord_dt());
    // keep the plate always at the same speed of the main reference, plus the conveyor speed on X local axis
    conveyor_plate->SetPos_dt(conveyor_truss->GetPos_dt() + (ChVector<>(conveyor_speed, 0, 0) >> (*conveyor_truss)));

    conveyor_plate->Update(mytime, update_assets);

    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_ang(-conveyor_speed);
    // always zero pos. offset (trick):
    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_y0(+conveyor_speed * GetChTime());

    internal_link->Update(mytime, update_assets);
}